

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_interpolation_qualifiers_abi_cxx11_(CompilerGLSL *this,Bitset *flags)

{
  bool bVar1;
  CompilerError *pCVar2;
  Bitset *in_RDX;
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [38];
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [38];
  undefined1 local_82;
  allocator local_81;
  string local_80 [39];
  allocator local_59;
  string local_58 [55];
  undefined1 local_21;
  Bitset *local_20;
  Bitset *flags_local;
  CompilerGLSL *this_local;
  string *res;
  
  local_21 = 0;
  local_20 = in_RDX;
  flags_local = flags;
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  bVar1 = Bitset::get(local_20,0xe);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"flat ");
  }
  bVar1 = Bitset::get(local_20,0xd);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"noperspective ");
  }
  bVar1 = Bitset::get(local_20,0x10);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"centroid ");
  }
  bVar1 = Bitset::get(local_20,0xf);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"patch ");
  }
  bVar1 = Bitset::get(local_20,0x11);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"sample ");
  }
  bVar1 = Bitset::get(local_20,0x12);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"invariant ");
  }
  bVar1 = Bitset::get(local_20,0x1497);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"perprimitiveEXT ");
  }
  bVar1 = Bitset::get(local_20,4999);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,"GL_AMD_shader_explicit_vertex_parameter",&local_59);
    require_extension_internal((CompilerGLSL *)flags,(string *)local_58);
    ::std::__cxx11::string::~string(local_58);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    ::std::__cxx11::string::operator+=((string *)this,"__explicitInterpAMD ");
  }
  bVar1 = Bitset::get(local_20,0x14a5);
  if (bVar1) {
    if ((((ulong)flags[0x77].higher._M_h._M_before_begin._M_nxt & 1) != 0) &&
       (*(uint *)((long)&flags[0x77].higher._M_h._M_bucket_count + 4) < 0x140)) {
      local_82 = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_80,"pervertexEXT requires ESSL 320.",&local_81);
      CompilerError::CompilerError(pCVar2,(string *)local_80);
      local_82 = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((ulong)flags[0x77].higher._M_h._M_before_begin._M_nxt & 1) == 0) &&
       (*(uint *)((long)&flags[0x77].higher._M_h._M_bucket_count + 4) < 0x1c2)) {
      local_aa = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a8,"pervertexEXT requires GLSL 450.",&local_a9);
      CompilerError::CompilerError(pCVar2,(string *)local_a8);
      local_aa = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((uint)flags[0x92].higher._M_h._M_rehash_policy._M_max_load_factor & 1) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f8,"GL_EXT_fragment_shader_barycentric",&local_f9);
      require_extension_internal((CompilerGLSL *)flags,(string *)local_f8);
      ::std::__cxx11::string::~string(local_f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      ::std::__cxx11::string::operator+=((string *)this,"pervertexEXT ");
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d0,"GL_NV_fragment_shader_barycentric",&local_d1);
      require_extension_internal((CompilerGLSL *)flags,(string *)local_d0);
      ::std::__cxx11::string::~string(local_d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      ::std::__cxx11::string::operator+=((string *)this,"pervertexNV ");
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "smooth ";
	if (flags.get(DecorationFlat))
		res += "flat ";
	if (flags.get(DecorationNoPerspective))
		res += "noperspective ";
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch ";
	if (flags.get(DecorationSample))
		res += "sample ";
	if (flags.get(DecorationInvariant))
		res += "invariant ";
	if (flags.get(DecorationPerPrimitiveEXT))
	    res += "perprimitiveEXT ";

	if (flags.get(DecorationExplicitInterpAMD))
	{
		require_extension_internal("GL_AMD_shader_explicit_vertex_parameter");
		res += "__explicitInterpAMD ";
	}

	if (flags.get(DecorationPerVertexKHR))
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("pervertexEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("pervertexEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			res += "pervertexNV ";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			res += "pervertexEXT ";
		}
	}

	return res;
}